

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
resizeLike<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,2,1,0,2,1>,0,Eigen::Stride<0,0>>const>>
          (PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this,
          EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
          *_other)

{
  Index nbRows;
  PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this_00;
  Index IVar1;
  EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_RSI;
  Index in_RDI;
  bool bVar2;
  Index othersize;
  CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *other;
  
  EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  ::derived(in_RSI);
  nbRows = CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
           ::rows((CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
                   *)0x2f4e01);
  CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
  ::cols((CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
          *)0x2f4e10);
  this_00 = (PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)
            CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
            ::rows((CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)0x2f4e29);
  CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
  ::cols((CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
          *)0x2f4e38);
  IVar1 = CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
          ::rows((CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)0x2f4e53);
  bVar2 = true;
  if (IVar1 != 1) {
    IVar1 = CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
            ::cols((CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)0x2f4e6c);
    bVar2 = IVar1 == 1;
  }
  if (!bVar2) {
    __assert_fail("other.rows() == 1 || other.cols() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x147,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 2, 1>>::resizeLike(const EigenBase<OtherDerived> &) [Derived = Eigen::Matrix<double, 2, 1>, OtherDerived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Map<Eigen::Matrix<double, 2, 1>>>]"
                 );
  }
  PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::resize(this_00,nbRows,in_RDI);
  return;
}

Assistant:

EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(Index(other.rows()), Index(other.cols()));
      const Index othersize = Index(other.rows())*Index(other.cols());
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }